

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventHelpers.cpp
# Opt level: O3

void OIS::EventUtils::enumerateForceFeedback(int deviceID,LinuxForceFeedback **ff)

{
  EForce force;
  int iVar1;
  uint uVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  LinuxForceFeedback *pLVar5;
  SupportedEffectList *pSVar6;
  undefined8 *puVar7;
  uchar ff_bits [16];
  map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
  forceMap;
  map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
  typeMap;
  key_type local_a8 [2];
  undefined8 uStack_a0;
  uint local_94;
  _Rb_tree<int,_std::pair<const_int,_OIS::Effect::EForce>,_std::_Select1st<std::pair<const_int,_OIS::Effect::EForce>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_OIS::Effect::EType>,_std::_Select1st<std::pair<const_int,_OIS::Effect::EType>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl._0_4_ = 0x52;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar3 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)&local_60,(key_type *)&local_90);
  *pmVar3 = Constant;
  local_90._M_impl._0_4_ = 0x57;
  pmVar3 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)&local_60,(key_type *)&local_90);
  *pmVar3 = Ramp;
  local_90._M_impl._0_4_ = 0x53;
  pmVar3 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)&local_60,(key_type *)&local_90);
  *pmVar3 = Spring;
  local_90._M_impl._0_4_ = 0x54;
  pmVar3 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)&local_60,(key_type *)&local_90);
  *pmVar3 = Friction;
  local_90._M_impl._0_4_ = 0x58;
  pmVar3 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)&local_60,(key_type *)&local_90);
  *pmVar3 = Square;
  local_90._M_impl._0_4_ = 0x59;
  pmVar3 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)&local_60,(key_type *)&local_90);
  *pmVar3 = Triangle;
  local_90._M_impl._0_4_ = 0x5a;
  pmVar3 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)&local_60,(key_type *)&local_90);
  *pmVar3 = Sine;
  local_90._M_impl._0_4_ = 0x5b;
  pmVar3 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)&local_60,(key_type *)&local_90);
  *pmVar3 = SawToothUp;
  local_90._M_impl._0_4_ = 0x5c;
  pmVar3 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)&local_60,(key_type *)&local_90);
  *pmVar3 = SawToothDown;
  local_90._M_impl._0_4_ = 0x55;
  pmVar3 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)&local_60,(key_type *)&local_90);
  *pmVar3 = Damper;
  local_90._M_impl._0_4_ = 0x56;
  pmVar3 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)&local_60,(key_type *)&local_90);
  *pmVar3 = Inertia;
  local_90._M_impl._0_4_ = 0x5d;
  pmVar3 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)&local_60,(key_type *)&local_90);
  *pmVar3 = Custom;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8[0] = 0x52;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar4 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[]((map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
                         *)&local_90,local_a8);
  *pmVar4 = ConstantForce;
  local_a8[0] = 0x57;
  pmVar4 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[]((map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
                         *)&local_90,local_a8);
  *pmVar4 = RampForce;
  local_a8[0] = 0x53;
  pmVar4 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[]((map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
                         *)&local_90,local_a8);
  *pmVar4 = ConditionalForce;
  local_a8[0] = 0x54;
  pmVar4 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[]((map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
                         *)&local_90,local_a8);
  *pmVar4 = ConditionalForce;
  local_a8[0] = 0x58;
  pmVar4 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[]((map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
                         *)&local_90,local_a8);
  *pmVar4 = PeriodicForce;
  local_a8[0] = 0x59;
  pmVar4 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[]((map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
                         *)&local_90,local_a8);
  *pmVar4 = PeriodicForce;
  local_a8[0] = 0x5a;
  pmVar4 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[]((map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
                         *)&local_90,local_a8);
  *pmVar4 = PeriodicForce;
  local_a8[0] = 0x5b;
  pmVar4 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[]((map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
                         *)&local_90,local_a8);
  *pmVar4 = PeriodicForce;
  local_a8[0] = 0x5c;
  pmVar4 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[]((map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
                         *)&local_90,local_a8);
  *pmVar4 = PeriodicForce;
  local_a8[0] = 0x55;
  pmVar4 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[]((map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
                         *)&local_90,local_a8);
  *pmVar4 = ConditionalForce;
  local_a8[0] = 0x56;
  pmVar4 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[]((map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
                         *)&local_90,local_a8);
  *pmVar4 = ConditionalForce;
  local_a8[0] = 0x5d;
  pmVar4 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[]((map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
                         *)&local_90,local_a8);
  *pmVar4 = CustomForce;
  if (*ff != (LinuxForceFeedback *)0x0) {
    (*((*ff)->super_ForceFeedback).super_Interface._vptr_Interface[1])();
  }
  *ff = (LinuxForceFeedback *)0x0;
  pLVar5 = (LinuxForceFeedback *)operator_new(0x78);
  LinuxForceFeedback::LinuxForceFeedback(pLVar5,deviceID);
  *ff = pLVar5;
  local_a8[0] = 0;
  local_a8[1] = 0;
  uStack_a0 = 0;
  iVar1 = ioctl(deviceID,0x80104535);
  if (iVar1 != -1) {
    local_94 = 0x50;
    do {
      uVar2 = local_94;
      if (((local_94 & 0xfffffffe) != 0x50) &&
         ((*(byte *)((long)local_a8 + (ulong)(local_94 >> 3)) >> (local_94 & 7) & 1) != 0)) {
        pLVar5 = *ff;
        pmVar4 = std::
                 map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
                 ::operator[]((map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
                               *)&local_90,(key_type *)&local_94);
        force = *pmVar4;
        pmVar3 = std::
                 map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                 ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                               *)&local_60,(key_type *)&local_94);
        ForceFeedback::_addEffectTypes(&pLVar5->super_ForceFeedback,force,*pmVar3);
        uVar2 = local_94;
      }
      local_94 = uVar2 + 1;
    } while ((int)uVar2 < 0x5d);
    if ((uStack_a0 & 0x100000000) != 0) {
      ForceFeedback::_setGainSupport(&(*ff)->super_ForceFeedback,true);
    }
    if ((uStack_a0._4_1_ & 2) != 0) {
      ForceFeedback::_setAutoCenterSupport(&(*ff)->super_ForceFeedback,true);
    }
    pSVar6 = ForceFeedback::getSupportedEffects(&(*ff)->super_ForceFeedback);
    if ((pSVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
      if (*ff != (LinuxForceFeedback *)0x0) {
        (*((*ff)->super_ForceFeedback).super_Interface._vptr_Interface[1])();
      }
      *ff = (LinuxForceFeedback *)0x0;
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_OIS::Effect::EForce>,_std::_Select1st<std::pair<const_int,_OIS::Effect::EForce>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
    ::~_Rb_tree(&local_90);
    std::
    _Rb_tree<int,_std::pair<const_int,_OIS::Effect::EType>,_std::_Select1st<std::pair<const_int,_OIS::Effect::EType>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
    ::~_Rb_tree(&local_60);
    return;
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(0x20);
  *puVar7 = &PTR__exception_001228d0;
  puVar7[1] = 0x14c00000008;
  puVar7[2] = 
  "/workspace/llm4binary/github/license_c_cmakelists/wgois[P]OIS/src/linux/EventHelpers.cpp";
  puVar7[3] = "Could not read device force feedback features";
  __cxa_throw(puVar7,&Exception::typeinfo,std::exception::~exception);
}

Assistant:

void EventUtils::enumerateForceFeedback(int deviceID, LinuxForceFeedback** ff)
{
	//Linux Event to OIS Event Mappings
	map<int, Effect::EType> typeMap;
	typeMap[FF_CONSTANT] = Effect::Constant;
	typeMap[FF_RAMP]	 = Effect::Ramp;
	typeMap[FF_SPRING]	 = Effect::Spring;
	typeMap[FF_FRICTION] = Effect::Friction;
	typeMap[FF_SQUARE]	 = Effect::Square;
	typeMap[FF_TRIANGLE] = Effect::Triangle;
	typeMap[FF_SINE]	 = Effect::Sine;
	typeMap[FF_SAW_UP]	 = Effect::SawToothUp;
	typeMap[FF_SAW_DOWN] = Effect::SawToothDown;
	typeMap[FF_DAMPER]	 = Effect::Damper;
	typeMap[FF_INERTIA]	 = Effect::Inertia;
	typeMap[FF_CUSTOM]	 = Effect::Custom;

	map<int, Effect::EForce> forceMap;
	forceMap[FF_CONSTANT] = Effect::ConstantForce;
	forceMap[FF_RAMP]	  = Effect::RampForce;
	forceMap[FF_SPRING]	  = Effect::ConditionalForce;
	forceMap[FF_FRICTION] = Effect::ConditionalForce;
	forceMap[FF_SQUARE]	  = Effect::PeriodicForce;
	forceMap[FF_TRIANGLE] = Effect::PeriodicForce;
	forceMap[FF_SINE]	  = Effect::PeriodicForce;
	forceMap[FF_SAW_UP]	  = Effect::PeriodicForce;
	forceMap[FF_SAW_DOWN] = Effect::PeriodicForce;
	forceMap[FF_DAMPER]	  = Effect::ConditionalForce;
	forceMap[FF_INERTIA]  = Effect::ConditionalForce;
	forceMap[FF_CUSTOM]	  = Effect::CustomForce;

	//Remove any previously existing memory and create fresh
	removeForceFeedback(ff);
	*ff = new LinuxForceFeedback(deviceID);

	//Read overall force feedback features
	unsigned char ff_bits[1 + FF_MAX / 8 / sizeof(unsigned char)];
	memset(ff_bits, 0, sizeof(ff_bits));

#ifdef OIS_LINUX_JOY_DEBUG
	cout << "EventUtils::enumerateForceFeedback(" << deviceID
		 << ") : Reading device force feedback features" << endl;
#endif

	if(ioctl(deviceID, EVIOCGBIT(EV_FF, sizeof(ff_bits)), ff_bits) == -1)
		OIS_EXCEPT(E_General, "Could not read device force feedback features");

#ifdef OIS_LINUX_JOY_DEBUG
	cout << "FF bits: " << hex;
	for(int i = 0; i < sizeof(ff_bits); i++)
		cout << (int)ff_bits[i];
	cout << endl
		 << dec;
#endif

	//FF Axes
	//if( isBitSet(ff_bits, ABS_X) ) //X Axis
	//if( isBitSet(ff_bits, ABS_Y) ) //Y Axis
	//if( isBitSet(ff_bits, ABS_WHEEL) ) //Wheel

	//FF Effects
	for(int effect = FF_EFFECT_MIN; effect <= FF_WAVEFORM_MAX; effect++)
	{
		// The RUMBLE force type is ignored, as periodic force one is more powerfull.
		// The PERIODIC force type is processed later, for each associated periodic effect type.
		if(effect == FF_RUMBLE || effect == FF_PERIODIC)
			continue;

		if(isBitSet(ff_bits, effect))
		{
#ifdef OIS_LINUX_JOY_DEBUG
			cout << "  Effect Type: " << Effect::getEffectTypeName(typeMap[effect]) << endl;
#endif

			(*ff)->_addEffectTypes(forceMap[effect], typeMap[effect]);
		}
	}

	//FF device properties
	if(isBitSet(ff_bits, FF_GAIN))
		(*ff)->_setGainSupport(true);

	if(isBitSet(ff_bits, FF_AUTOCENTER))
		(*ff)->_setAutoCenterSupport(true);

	//Check to see if any effects were added, else destroy the pointer
	const ForceFeedback::SupportedEffectList& list = (*ff)->getSupportedEffects();
	if(list.size() == 0)
		removeForceFeedback(ff);
}